

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_update<char,false,5>
          (immutable *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t index,char element)

{
  int *piVar1;
  uint32_t uVar2;
  uint uVar3;
  rrb<char,_false,_5> *prVar4;
  ref<immutable::rrb_details::internal_node<char,_false>_> rVar5;
  rrb_size_table<false> *prVar6;
  uint32_t *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  tree_node<char,_false> *ptVar10;
  uint32_t uVar11;
  uint uVar12;
  undefined8 *puVar13;
  internal_node<char,_false> *piVar14;
  leaf_node<char,_false> *plVar15;
  undefined7 in_register_00000009;
  char *__function;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  ref<immutable::rrb_details::internal_node<char,false>> *this_00;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::leaf_node<char,_false>_> leaf;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  undefined4 local_4c;
  rrb<char,_false,_5> *local_48;
  uint32_t local_3c;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_38;
  
  prVar4 = in->ptr;
  if (prVar4 != (rrb<char,_false,_5> *)0x0) {
    local_4c = (undefined4)CONCAT71(in_register_00000009,element);
    if (prVar4->cnt <= index) {
      __assert_fail("index < in->cnt",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x79b,
                    "ref<rrb<T, atomic_ref_counting, N>> immutable::rrb_update(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t, T) [T = char, atomic_ref_counting = false, N = 5]"
                   );
    }
    puVar13 = (undefined8 *)malloc(0x28);
    uVar8 = *(undefined8 *)prVar4;
    uVar9 = *(undefined8 *)&prVar4->tail_len;
    ptVar10 = (prVar4->root).ptr;
    puVar13[2] = (prVar4->tail).ptr;
    puVar13[3] = ptVar10;
    *puVar13 = uVar8;
    puVar13[1] = uVar9;
    puVar13[4] = *(undefined8 *)&prVar4->_ref_count;
    if (puVar13[3] != 0) {
      piVar1 = (int *)(puVar13[3] + 8);
      *piVar1 = *piVar1 + 1;
    }
    if (puVar13[2] != 0) {
      piVar1 = (int *)(puVar13[2] + 8);
      *piVar1 = *piVar1 + 1;
    }
    *(undefined8 **)this = puVar13;
    if (puVar13 != (undefined8 *)0x0) {
      *(undefined4 *)(puVar13 + 4) = 1;
    }
    uVar12 = prVar4->cnt - prVar4->tail_len;
    local_48 = (rrb<char,_false,_5> *)this;
    if (index < uVar12) {
      if (puVar13 != (undefined8 *)0x0) {
        rVar5.ptr = (internal_node<char,_false> *)(prVar4->root).ptr;
        if (rVar5.ptr != (internal_node<char,_false> *)0x0) {
          (rVar5.ptr)->_ref_count = (rVar5.ptr)->_ref_count + 1;
        }
        this_00 = (ref<immutable::rrb_details::internal_node<char,false>> *)(puVar13 + 3);
        uVar11 = prVar4->shift;
        uVar2 = local_3c;
        while (local_3c = uVar11, local_60.ptr = rVar5.ptr, local_3c != 0) {
          uVar12 = (rVar5.ptr)->len;
          piVar14 = (internal_node<char,_false> *)malloc((ulong)uVar12 * 8 + 0x20);
          piVar14->len = uVar12;
          piVar14->type = INTERNAL_NODE;
          (piVar14->size_table).ptr = (rrb_size_table<false> *)0x0;
          ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                    (&piVar14->size_table,&(rVar5.ptr)->size_table);
          piVar14->guid = 0;
          piVar14->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar14 + 1)
          ;
          uVar12 = (rVar5.ptr)->len;
          memset(piVar14 + 1,0,(ulong)uVar12 * 8);
          if ((ulong)uVar12 != 0) {
            lVar19 = 0;
            uVar17 = 0;
            do {
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                         ((long)&piVar14->child->ptr + lVar19),
                         (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                         ((long)&(rVar5.ptr)->child->ptr + lVar19));
              uVar17 = uVar17 + 1;
              lVar19 = lVar19 + 8;
            } while (uVar17 < (rVar5.ptr)->len);
          }
          piVar14->_ref_count = 1;
          local_58.ptr = piVar14;
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=(&local_60,&local_58);
          rrb_details::release<char>(local_58.ptr);
          uVar2 = local_3c;
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this_00,&local_60);
          if (local_60.ptr == (internal_node<char,_false> *)0x0) {
            __function = 
            "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
            ;
            goto LAB_00148bd9;
          }
          prVar6 = ((local_60.ptr)->size_table).ptr;
          uVar12 = index >> ((byte)uVar2 & 0x1f);
          if (prVar6 == (rrb_size_table<false> *)0x0) {
            uVar17 = (ulong)(uVar12 & 0x1f);
          }
          else {
            puVar7 = prVar6->size;
            uVar17 = (ulong)(uVar12 - 1);
            do {
              uVar16 = uVar17;
              uVar12 = (int)uVar16 + 1;
              uVar17 = (ulong)uVar12;
            } while (puVar7[uVar17] <= index);
            if (uVar12 != 0) {
              index = index - puVar7[uVar16];
            }
          }
          this_00 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                    ((local_60.ptr)->child + uVar17);
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    (&local_60,(ref<immutable::rrb_details::internal_node<char,_false>_> *)this_00);
          rVar5.ptr = local_60.ptr;
          uVar11 = uVar2 - 5;
          uVar2 = local_3c;
        }
        if (rVar5.ptr != (internal_node<char,_false> *)0x0) {
          (rVar5.ptr)->_ref_count = (rVar5.ptr)->_ref_count + 1;
        }
        uVar12 = (rVar5.ptr)->len;
        sVar18 = (ulong)uVar12 + 0x18;
        local_58.ptr = rVar5.ptr;
        local_3c = uVar2;
        plVar15 = (leaf_node<char,_false> *)malloc(sVar18);
        memset(plVar15,0,sVar18);
        prVar4 = local_48;
        plVar15->len = uVar12;
        plVar15->type = LEAF_NODE;
        plVar15->child = (char *)(plVar15 + 1);
        plVar15->guid = 0;
        if ((rVar5.ptr)->len != 0) {
          uVar17 = 0;
          do {
            plVar15->child[uVar17] =
                 *(char *)((long)&(((rVar5.ptr)->size_table).ptr)->size + uVar17);
            uVar17 = uVar17 + 1;
          } while (uVar17 < (rVar5.ptr)->len);
        }
        plVar15->_ref_count = 1;
        local_38.ptr = plVar15;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58,&local_38);
        if ((local_38.ptr != (leaf_node<char,_false> *)0x0) &&
           (uVar2 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_38.ptr);
        }
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  (this_00,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
        if (local_58.ptr != (internal_node<char,_false> *)0x0) {
          *(char *)((long)&(((local_58.ptr)->size_table).ptr)->size + (ulong)(index & 0x1f)) =
               (char)local_4c;
          if ((local_58.ptr != (internal_node<char,_false> *)0x0) &&
             (uVar2 = (local_58.ptr)->_ref_count, (local_58.ptr)->_ref_count = uVar2 - 1, uVar2 == 1
             )) {
            free(local_58.ptr);
          }
          rrb_details::release<char>(local_60.ptr);
          return (ref<immutable::rrb<char,_false,_5>_>)prVar4;
        }
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
        ;
        goto LAB_00148bd9;
      }
    }
    else {
      plVar15 = (prVar4->tail).ptr;
      uVar3 = plVar15->len;
      sVar18 = (ulong)uVar3 + 0x18;
      piVar14 = (internal_node<char,_false> *)malloc(sVar18);
      memset(piVar14,0,sVar18);
      prVar4 = local_48;
      piVar14->len = uVar3;
      piVar14->type = LEAF_NODE;
      (piVar14->size_table).ptr = (rrb_size_table<false> *)&piVar14->child;
      piVar14->guid = 0;
      if (plVar15->len != 0) {
        uVar17 = 0;
        do {
          *(char *)((long)&((piVar14->size_table).ptr)->size + uVar17) = plVar15->child[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar17 < plVar15->len);
      }
      piVar14->_ref_count = 1;
      *(char *)((long)&((piVar14->size_table).ptr)->size + (ulong)(index - uVar12)) = (char)local_4c
      ;
      local_60.ptr = piVar14;
      if (*(long *)local_48 != 0) {
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)
                   (*(long *)local_48 + 0x10),
                   (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_60);
        if ((local_60.ptr != (internal_node<char,_false> *)0x0) &&
           (uVar2 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_60.ptr);
        }
        return (ref<immutable::rrb<char,_false,_5>_>)prVar4;
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb<char, false>>::operator->() const [T = immutable::rrb<char, false>]"
  ;
LAB_00148bd9:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }